

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::SSARewriter::GetReachingDef(SSARewriter *this,uint32_t var_id,BasicBlock *bb)

{
  IRContext *pIVar1;
  CFG *this_00;
  Instruction *this_01;
  uint32_t uVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  uint32_t *puVar4;
  BasicBlock *bb_00;
  PhiCandidate *phi_candidate;
  ulong uVar5;
  
  uVar2 = GetValueAtBlock(this,var_id,bb);
  if (uVar2 != 0) {
    return uVar2;
  }
  pIVar1 = (this->pass_->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar1);
  }
  this_00 = (pIVar1->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  this_01 = (bb->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar2 = 0;
  if (this_01->has_result_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
  }
  pvVar3 = CFG::preds(this_00,uVar2);
  puVar4 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar4;
  if (uVar5 == 4) {
    pIVar1 = (this->pass_->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(pIVar1);
      puVar4 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    bb_00 = CFG::block((pIVar1->cfg_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                       .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,*puVar4);
    uVar2 = GetReachingDef(this,var_id,bb_00);
LAB_0019b86a:
    if (uVar2 != 0) goto LAB_0019b886;
  }
  else if (4 < uVar5) {
    phi_candidate = CreatePhiCandidate(this,var_id,bb);
    WriteVariable(this,var_id,bb,phi_candidate->result_id_);
    uVar2 = AddPhiOperands(this,phi_candidate);
    goto LAB_0019b86a;
  }
  uVar2 = MemPass::GetUndefVal(this->pass_,var_id);
  if (uVar2 == 0) {
    return 0;
  }
LAB_0019b886:
  WriteVariable(this,var_id,bb,uVar2);
  return uVar2;
}

Assistant:

uint32_t SSARewriter::GetReachingDef(uint32_t var_id, BasicBlock* bb) {
  // If |var_id| has a definition in |bb|, return it.
  uint32_t val_id = GetValueAtBlock(var_id, bb);
  if (val_id != 0) return val_id;

  // Otherwise, look up the value for |var_id| in |bb|'s predecessors.
  auto& predecessors = pass_->cfg()->preds(bb->id());
  if (predecessors.size() == 1) {
    // If |bb| has exactly one predecessor, we look for |var_id|'s definition
    // there.
    val_id = GetReachingDef(var_id, pass_->cfg()->block(predecessors[0]));
  } else if (predecessors.size() > 1) {
    // If there is more than one predecessor, this is a join block which may
    // require a Phi instruction.  This will act as |var_id|'s current
    // definition to break potential cycles.
    PhiCandidate& phi_candidate = CreatePhiCandidate(var_id, bb);

    // Set the value for |bb| to avoid an infinite recursion.
    WriteVariable(var_id, bb, phi_candidate.result_id());
    val_id = AddPhiOperands(&phi_candidate);
  }

  // If we could not find a store for this variable in the path from the root
  // of the CFG, the variable is not defined, so we use undef.
  if (val_id == 0) {
    val_id = pass_->GetUndefVal(var_id);
    if (val_id == 0) {
      return 0;
    }
  }

  WriteVariable(var_id, bb, val_id);

  return val_id;
}